

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

Image<eos::core::Pixel<unsigned_char,_4>_> * __thiscall
eos::core::image::constant<eos::core::Pixel<unsigned_char,4>>
          (Image<eos::core::Pixel<unsigned_char,_4>_> *__return_storage_ptr__,image *this,int height
          ,int width,Pixel<unsigned_char,_4> value)

{
  Pixel<unsigned_char,_4> *pPVar1;
  int local_28;
  int local_24;
  int x;
  int y;
  int width_local;
  int height_local;
  Pixel<unsigned_char,_4> value_local;
  Image<eos::core::Pixel<unsigned_char,_4>_> *image;
  
  Image<eos::core::Pixel<unsigned_char,_4>_>::Image(__return_storage_ptr__,(int)this,height);
  for (local_24 = 0; local_24 < (int)this; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < height; local_28 = local_28 + 1) {
      pPVar1 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                         (__return_storage_ptr__,local_24,local_28);
      *(int *)(pPVar1->data_)._M_elems = width;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image<PixelType> constant(int height, int width, PixelType value) noexcept
{
    Image<PixelType> image(height, width);
    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {
            image(y, x) = value;
        }
    }
    return image;
}